

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O0

int __thiscall
ncnn::ConvolutionDepthWise_x86::forward
          (ConvolutionDepthWise_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined1 uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  const_reference ppLVar5;
  int iVar6;
  Mat *in_RCX;
  Mat *in_RDX;
  long in_RSI;
  long *in_RDI;
  Option opt_g;
  Layer *op;
  Mat top_blob_g;
  Mat bottom_blob_bordered_g;
  int g;
  int num_output_g;
  int channels_g;
  int outh;
  int outw;
  Mat bottom_blob_bordered;
  int kernel_extent_h;
  int kernel_extent_w;
  size_t elemsize;
  int channels;
  int h;
  int w;
  Option *in_stack_00000210;
  Mat *in_stack_00000218;
  Mat *in_stack_00000220;
  ConvolutionDepthWise_x86 *in_stack_00000228;
  undefined6 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe86;
  undefined1 in_stack_fffffffffffffe87;
  Mat *this_00;
  int in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  Mat *in_stack_fffffffffffffea0;
  undefined1 local_130 [64];
  undefined1 local_f0 [56];
  Option *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  Mat *in_stack_ffffffffffffffb0;
  Mat *bottom_blob_00;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar7;
  int iVar8;
  int local_4;
  
  if (((in_RCX->elempack & 0x10000) != 0) &&
     (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x150) == 1)) {
    iVar3 = forward_int8_x86(in_stack_00000228,in_stack_00000220,in_stack_00000218,in_stack_00000210
                            );
    return iVar3;
  }
  iVar3 = *(int *)(in_RSI + 0x34);
  bottom_blob_00 = *(Mat **)(in_RSI + 0x10);
  iVar6 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xc4) *
          (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xbc) + -1) + 1;
  iVar4 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 200) *
          (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xc0) + -1) + 1;
  this_00 = (Mat *)&stack0xffffffffffffff78;
  Mat::Mat(this_00);
  ConvolutionDepthWise::make_padding
            ((ConvolutionDepthWise *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             (Mat *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
             (Mat *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             in_stack_ffffffffffffff48);
  uVar1 = Mat::empty((Mat *)CONCAT17(in_stack_fffffffffffffe87,
                                     CONCAT16(in_stack_fffffffffffffe86,in_stack_fffffffffffffe80)))
  ;
  if ((bool)uVar1) {
    local_4 = -100;
  }
  else {
    iVar7 = in_stack_ffffffffffffffa8;
    iVar8 = in_stack_ffffffffffffffa4;
    Mat::create(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98,
                (int)((ulong)in_RDI >> 0x20),(size_t)this_00,
                (Allocator *)
                CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffe86,in_stack_fffffffffffffe80)));
    bVar2 = Mat::empty((Mat *)CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffe86,
                                                      in_stack_fffffffffffffe80)));
    if (bVar2) {
      local_4 = -100;
    }
    else {
      if ((iVar3 == *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf0)) &&
         (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf0) ==
          *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xb8))) {
        if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xbc) == 3) &&
           ((((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xc0) == 3 &&
              (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xc4) == 1)) &&
             (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 200) == 1)) &&
            ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xcc) == 1 &&
             (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 1)))))) {
          convdw3x3s1_sse(in_RDX,in_RCX,(Mat *)CONCAT44(iVar8,iVar7),
                          (Mat *)CONCAT44(iVar3,in_stack_ffffffffffffffc8),(Option *)bottom_blob_00)
          ;
          if (in_RDI[1] != 0) {
            (**(code **)(*(long *)in_RDI[1] + 0x48))((long *)in_RDI[1],in_RDX,in_RCX);
          }
          local_4 = 0;
          goto LAB_001ba659;
        }
        if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xbc) == 3) &&
           (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xc0) == 3 &&
             (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xc4) == 1)) &&
            ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 200) == 1 &&
             ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xcc) == 2 &&
              (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 2)))))))) {
          convdw3x3s2_sse(bottom_blob_00,(Mat *)CONCAT44(iVar6,iVar4),in_stack_ffffffffffffffb0,
                          (Mat *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                          (Option *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
          if (in_RDI[1] != 0) {
            (**(code **)(*(long *)in_RDI[1] + 0x48))((long *)in_RDI[1],in_RDX,in_RCX);
          }
          local_4 = 0;
          goto LAB_001ba659;
        }
      }
      for (iVar3 = 0; iVar3 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf0);
          iVar3 = iVar3 + 1) {
        Mat::channel_range((Mat *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                           (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
        Mat::channel_range((Mat *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                           (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
        ppLVar5 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 2),
                             (long)iVar3);
        in_stack_fffffffffffffe98 = *(int *)&in_RCX->data;
        in_stack_fffffffffffffe9c = *(int *)((long)&in_RCX->data + 4);
        (*(*ppLVar5)->_vptr_Layer[7])(*ppLVar5,local_f0,local_130,&stack0xfffffffffffffe98);
        Mat::~Mat((Mat *)0x1ba5dd);
        Mat::~Mat((Mat *)0x1ba5ea);
      }
      local_4 = 0;
    }
  }
LAB_001ba659:
  Mat::~Mat((Mat *)0x1ba666);
  return local_4;
}

Assistant:

int ConvolutionDepthWise_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    // float32
    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels == group && group == num_output)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convdw3x3s1_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }

            return 0;
        }
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convdw3x3s2_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }

            return 0;
        }
    }

    // group convolution
    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

    for (int g=0; g<group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered.channel_range(channels_g * g, channels_g);
        Mat top_blob_g = top_blob.channel_range(num_output_g * g, num_output_g);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob.allocator;

        // forward
        op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
    }

    return 0;
}